

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall cmGeneratorTarget::ComputeAllConfigSources(cmGeneratorTarget *this)

{
  iterator __x;
  bool bVar1;
  KindedSources *pKVar2;
  reference config;
  KindedSources *pKVar3;
  size_type sVar4;
  pointer ppVar5;
  reference pvVar6;
  __enable_if_t<is_constructible<value_type,_pair<const_cmSourceFile_*const,_unsigned_long>_&>::value,_pair<iterator,_bool>_>
  _Var7;
  unsigned_long local_e8;
  undefined1 local_e0 [8];
  value_type entry;
  AllConfigSource acs;
  _Self local_a0;
  iterator mi;
  SourceAndKind *src;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
  *__range2;
  KindedSources *sources;
  size_t ci;
  map<const_cmSourceFile_*,_unsigned_long,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
  index;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  cmGeneratorTarget *this_local;
  
  cmMakefile::GetGeneratorConfigs_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&index._M_t._M_impl.super__Rb_tree_header._M_node_count,this->Makefile,
             IncludeEmptyConfig);
  std::
  map<const_cmSourceFile_*,_unsigned_long,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
  ::map((map<const_cmSourceFile_*,_unsigned_long,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
         *)&ci);
  for (sources = (KindedSources *)0x0; pKVar3 = sources,
      pKVar2 = (KindedSources *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&index._M_t._M_impl.super__Rb_tree_header._M_node_count), pKVar3 < pKVar2;
      sources = (KindedSources *)
                ((long)&(sources->Sources).
                        super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1)) {
    config = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&index._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          (size_type)sources);
    pKVar3 = GetKindedSources(this,config);
    __end2 = std::
             vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
             ::begin(&pKVar3->Sources);
    src = (SourceAndKind *)
          std::
          vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
          ::end(&pKVar3->Sources);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_cmGeneratorTarget::SourceAndKind_*,_std::vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>_>
                                       *)&src), bVar1) {
      mi._M_node = (_Base_ptr)
                   __gnu_cxx::
                   __normal_iterator<const_cmGeneratorTarget::SourceAndKind_*,_std::vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>_>
                   ::operator*(&__end2);
      local_a0._M_node =
           (_Base_ptr)
           std::
           map<const_cmSourceFile_*,_unsigned_long,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
           ::find((map<const_cmSourceFile_*,_unsigned_long,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
                   *)&ci,(key_type *)mi._M_node);
      acs.Configs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    map<const_cmSourceFile_*,_unsigned_long,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
                    ::end((map<const_cmSourceFile_*,_unsigned_long,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
                           *)&ci);
      bVar1 = std::operator==(&local_a0,
                              (_Self *)&acs.Configs.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar1) {
        AllConfigSource::AllConfigSource((AllConfigSource *)&entry.second);
        entry.second = *(unsigned_long *)mi._M_node;
        acs.Source._0_4_ = *(undefined4 *)&(mi._M_node)->_M_right;
        std::
        vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
        ::push_back(&this->AllConfigSources,(value_type *)&entry.second);
        __x = mi;
        sVar4 = std::
                vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
                ::size(&this->AllConfigSources);
        local_e8 = sVar4 - 1;
        std::pair<const_cmSourceFile_*const,_unsigned_long>::
        pair<cmSourceFile_*const_&,_unsigned_long,_true>
                  ((pair<const_cmSourceFile_*const,_unsigned_long> *)local_e0,
                   (cmSourceFile **)__x._M_node,&local_e8);
        _Var7 = std::
                map<cmSourceFile_const*,unsigned_long,std::less<cmSourceFile_const*>,std::allocator<std::pair<cmSourceFile_const*const,unsigned_long>>>
                ::insert<std::pair<cmSourceFile_const*const,unsigned_long>&>
                          ((map<cmSourceFile_const*,unsigned_long,std::less<cmSourceFile_const*>,std::allocator<std::pair<cmSourceFile_const*const,unsigned_long>>>
                            *)&ci,(pair<const_cmSourceFile_*const,_unsigned_long> *)local_e0);
        local_a0._M_node = (_Base_ptr)_Var7.first._M_node;
        AllConfigSource::~AllConfigSource((AllConfigSource *)&entry.second);
      }
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>::
               operator->(&local_a0);
      pvVar6 = std::
               vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
               ::operator[](&this->AllConfigSources,ppVar5->second);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&pvVar6->Configs,(value_type_conflict2 *)&sources);
      __gnu_cxx::
      __normal_iterator<const_cmGeneratorTarget::SourceAndKind_*,_std::vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>_>
      ::operator++(&__end2);
    }
  }
  std::
  map<const_cmSourceFile_*,_unsigned_long,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
  ::~map((map<const_cmSourceFile_*,_unsigned_long,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
          *)&ci);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&index._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeAllConfigSources() const
{
  std::vector<std::string> configs =
    this->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  std::map<cmSourceFile const*, size_t> index;

  for (size_t ci = 0; ci < configs.size(); ++ci) {
    KindedSources const& sources = this->GetKindedSources(configs[ci]);
    for (SourceAndKind const& src : sources.Sources) {
      auto mi = index.find(src.Source.Value);
      if (mi == index.end()) {
        AllConfigSource acs;
        acs.Source = src.Source.Value;
        acs.Kind = src.Kind;
        this->AllConfigSources.push_back(std::move(acs));
        std::map<cmSourceFile const*, size_t>::value_type entry(
          src.Source.Value, this->AllConfigSources.size() - 1);
        mi = index.insert(entry).first;
      }
      this->AllConfigSources[mi->second].Configs.push_back(ci);
    }
  }
}